

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<long_long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase2
               (longlong lhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *pSVar2;
  longlong lVar3;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  longlong tmp;
  longlong *rhs_00;
  
  pSVar2 = (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           std::numeric_limits<long_long>::min();
  if ((in_RDI == pSVar2) && (lVar3 = ::SafeInt::operator_cast_to_long_long(in_RDI), lVar3 == -1)) {
    rhs_00 = (longlong *)0x0;
    bVar1 = div_negate_min<long_long,_long_long,_false>::Value((longlong *)&stack0xffffffffffffffd8)
    ;
    if (bVar1) {
      SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                (in_RDX,rhs_00);
      return true;
    }
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }